

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

half __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderBase::quantize
          (LossyDctEncoderBase *this,half src,float errorTolerance)

{
  unsigned_short uVar1;
  unsigned_short in_SI;
  LossyDctEncoderBase *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  int targetNumSetBits;
  unsigned_short *closest;
  int numSetBits;
  float srcFloat;
  half tmp;
  int local_2c;
  unsigned_short *local_28;
  half local_16;
  float local_14;
  half local_4 [2];
  
  local_14 = in_XMM0_Da;
  local_4[0]._h = in_SI;
  fVar2 = half::operator_cast_to_float(local_4);
  uVar1 = half::bits(local_4);
  local_2c = countSetBits(in_RDI,uVar1);
  uVar1 = half::bits(local_4);
  local_28 = (unsigned_short *)
             (&closestData + (ulong)*(uint *)(closestDataOffset + (ulong)uVar1 * 4) * 2);
  while( true ) {
    local_2c = local_2c + -1;
    if (local_2c < 0) {
      return (half)local_4[0]._h;
    }
    half::setBits(&local_16,*local_28);
    fVar3 = half::operator_cast_to_float(&local_16);
    dVar4 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar3 - fVar2));
    if (SUB84(dVar4,0) < local_14) break;
    local_28 = local_28 + 1;
  }
  return (half)local_16._h;
}

Assistant:

half
DwaCompressor::LossyDctEncoderBase::quantize (half src, float errorTolerance)
{
    half            tmp;
    float           srcFloat      = (float)src;
    int             numSetBits    = countSetBits(src.bits());
    const unsigned short *closest = closestData + closestDataOffset[src.bits()];

    for (int targetNumSetBits = numSetBits - 1;
         targetNumSetBits >= 0;
         --targetNumSetBits)
    {
        tmp.setBits (*closest);

        if (fabs ((float)tmp - srcFloat) < errorTolerance)
            return tmp;

        closest++;
    }

    return src;
}